

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpdir.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int __fd;
  int iVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  ulong local_4a0;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  char longentry [512];
  char mem [512];
  LIBSSH2_SFTP_HANDLE *sftp_handle;
  LIBSSH2_SFTP *sftp_session;
  LIBSSH2_SESSION *session;
  int rc;
  char *userauthlist;
  char *fingerprint;
  sockaddr_in sin;
  int auth_pw;
  int i;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  sin.sin_zero[0] = '\0';
  sin.sin_zero[1] = '\0';
  sin.sin_zero[2] = '\0';
  sin.sin_zero[3] = '\0';
  sftp_session = (LIBSSH2_SFTP *)0x0;
  if (argc < 2) {
    i = htonl(0x7f000001);
  }
  else {
    i = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    sftppath = argv[4];
  }
  uVar1 = libssh2_init(0);
  if (uVar1 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fprintf(_stderr,"failed to create socket.\n");
  }
  else {
    fingerprint._0_2_ = 2;
    fingerprint._2_2_ = htons(0x16);
    fingerprint._4_4_ = i;
    iVar2 = connect(__fd,(sockaddr *)&fingerprint,0x10);
    if (iVar2 == 0) {
      sftp_session = (LIBSSH2_SFTP *)libssh2_session_init_ex(0,0,0);
      if (sftp_session == (LIBSSH2_SFTP *)0x0) {
        fprintf(_stderr,"Could not initialize SSH session.\n");
      }
      else {
        uVar1 = libssh2_session_handshake(sftp_session,__fd);
        if (uVar1 == 0) {
          lVar3 = libssh2_hostkey_hash(sftp_session,2);
          fprintf(_stderr,"Fingerprint: ");
          sin.sin_zero[4] = '\0';
          sin.sin_zero[5] = '\0';
          sin.sin_zero[6] = '\0';
          sin.sin_zero[7] = '\0';
          for (; (int)sin.sin_zero._4_4_ < 0x14; sin.sin_zero._4_4_ = sin.sin_zero._4_4_ + 1) {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar3 + (int)sin.sin_zero._4_4_));
          }
          fprintf(_stderr,"\n");
          pcVar5 = username;
          sVar4 = strlen(username);
          pcVar5 = (char *)libssh2_userauth_list(sftp_session,pcVar5,sVar4 & 0xffffffff);
          if (pcVar5 != (char *)0x0) {
            fprintf(_stderr,"Authentication methods: %s\n",pcVar5);
            pcVar6 = strstr(pcVar5,"password");
            if (pcVar6 != (char *)0x0) {
              sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 1;
            }
            pcVar6 = strstr(pcVar5,"keyboard-interactive");
            if (pcVar6 != (char *)0x0) {
              sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 2;
            }
            pcVar5 = strstr(pcVar5,"publickey");
            if (pcVar5 != (char *)0x0) {
              sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 4;
            }
            if (5 < argc) {
              if (((sin.sin_zero._0_4_ & 1) != 0) && (iVar2 = strcmp(argv[5],"-p"), iVar2 == 0)) {
                sin.sin_zero[0] = '\x01';
                sin.sin_zero[1] = '\0';
                sin.sin_zero[2] = '\0';
                sin.sin_zero[3] = '\0';
              }
              if (((sin.sin_zero._0_4_ & 2) != 0) && (iVar2 = strcmp(argv[5],"-i"), iVar2 == 0)) {
                sin.sin_zero[0] = '\x02';
                sin.sin_zero[1] = '\0';
                sin.sin_zero[2] = '\0';
                sin.sin_zero[3] = '\0';
              }
              if (((sin.sin_zero._0_4_ & 4) != 0) && (iVar2 = strcmp(argv[5],"-k"), iVar2 == 0)) {
                sin.sin_zero[0] = '\x04';
                sin.sin_zero[1] = '\0';
                sin.sin_zero[2] = '\0';
                sin.sin_zero[3] = '\0';
              }
            }
            pcVar5 = username;
            if ((sin.sin_zero._0_4_ & 1) == 0) {
              if ((sin.sin_zero._0_4_ & 2) == 0) {
                if ((sin.sin_zero._0_4_ & 4) == 0) {
                  fprintf(_stderr,"No supported authentication methods found.\n");
                  goto LAB_00101aa2;
                }
                sVar4 = strlen(username);
                iVar2 = libssh2_userauth_publickey_fromfile_ex
                                  (sftp_session,pcVar5,sVar4 & 0xffffffff,pubkey,privkey,password);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Authentication by public key failed.\n");
                  goto LAB_00101aa2;
                }
                fprintf(_stderr,"Authentication by public key succeeded.\n");
              }
              else {
                sVar4 = strlen(username);
                iVar2 = libssh2_userauth_keyboard_interactive_ex
                                  (sftp_session,pcVar5,sVar4 & 0xffffffff,kbd_callback);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Authentication by keyboard-interactive failed.\n");
                  goto LAB_00101aa2;
                }
                fprintf(_stderr,"Authentication by keyboard-interactive succeeded.\n");
              }
            }
            else {
              sVar4 = strlen(username);
              pcVar6 = password;
              sVar7 = strlen(password);
              iVar2 = libssh2_userauth_password_ex
                                (sftp_session,pcVar5,sVar4 & 0xffffffff,pcVar6,sVar7 & 0xffffffff,0)
              ;
              if (iVar2 != 0) {
                fprintf(_stderr,"Authentication by password failed.\n");
                goto LAB_00101aa2;
              }
            }
          }
          fprintf(_stderr,"libssh2_sftp_init().\n");
          lVar3 = libssh2_sftp_init(sftp_session);
          if (lVar3 == 0) {
            fprintf(_stderr,"Unable to init SFTP session\n");
          }
          else {
            libssh2_session_set_blocking(sftp_session,1);
            fprintf(_stderr,"libssh2_sftp_opendir().\n");
            pcVar5 = sftppath;
            sVar4 = strlen(sftppath);
            lVar8 = libssh2_sftp_open_ex(lVar3,pcVar5,sVar4 & 0xffffffff,0,0,1);
            if (lVar8 == 0) {
              fprintf(_stderr,"Unable to open dir with SFTP\n");
            }
            else {
              fprintf(_stderr,"libssh2_sftp_opendir() is done, now receive listing.\n");
              while (iVar2 = libssh2_sftp_readdir_ex
                                       (lVar8,longentry + 0x1f8,0x200,&attrs.mtime,0x200,&local_4a0)
                    , 0 < iVar2) {
                if ((char)attrs.mtime == '\0') {
                  if ((local_4a0 & 4) == 0) {
                    printf("---------- ");
                  }
                  else {
                    printf("--fix----- ");
                  }
                  if ((local_4a0 & 2) == 0) {
                    printf("   -    - ");
                  }
                  else {
                    printf("%4d %4d ",attrs.filesize & 0xffffffff,attrs.uid & 0xffffffff);
                  }
                  if ((local_4a0 & 1) != 0) {
                    printf("%8llu ",attrs.flags);
                  }
                  printf("%s\n",longentry + 0x1f8);
                }
                else {
                  printf("%s\n",&attrs.mtime);
                }
              }
              libssh2_sftp_close_handle(lVar8);
              libssh2_sftp_shutdown(lVar3);
            }
          }
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar1);
        }
      }
    }
    else {
      fprintf(_stderr,"failed to connect.\n");
    }
  }
LAB_00101aa2:
  if (sftp_session != (LIBSSH2_SFTP *)0x0) {
    libssh2_session_disconnect_ex(sftp_session,0xb,"Normal Shutdown","");
    libssh2_session_free(sftp_session);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fprintf(_stderr,"all done\n");
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 0;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password")) {
            auth_pw |= 1;
        }
        if(strstr(userauthlist, "keyboard-interactive")) {
            auth_pw |= 2;
        }
        if(strstr(userauthlist, "publickey")) {
            auth_pw |= 4;
        }

        /* check for options */
        if(argc > 5) {
            if((auth_pw & 1) && !strcmp(argv[5], "-p")) {
                auth_pw = 1;
            }
            if((auth_pw & 2) && !strcmp(argv[5], "-i")) {
                auth_pw = 2;
            }
            if((auth_pw & 4) && !strcmp(argv[5], "-k")) {
                auth_pw = 4;
            }
        }

        if(auth_pw & 1) {
            /* We could authenticate via password */
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed.\n");
                goto shutdown;
            }
        }
        else if(auth_pw & 2) {
            /* Or via keyboard-interactive */
            if(libssh2_userauth_keyboard_interactive(session, username,
                                                     &kbd_callback) ) {
                fprintf(stderr,
                        "Authentication by keyboard-interactive failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr,
                        "Authentication by keyboard-interactive succeeded.\n");
            }
        }
        else if(auth_pw & 4) {
            /* Or by public key */
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found.\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "libssh2_sftp_init().\n");
    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    /* Since we have not set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    fprintf(stderr, "libssh2_sftp_opendir().\n");
    /* Request a dir listing via SFTP */
    sftp_handle = libssh2_sftp_opendir(sftp_session, sftppath);
    if(!sftp_handle) {
        fprintf(stderr, "Unable to open dir with SFTP\n");
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_opendir() is done, now receive listing.\n");
    do {
        char mem[512];
        char longentry[512];
        LIBSSH2_SFTP_ATTRIBUTES attrs;

        /* loop until we fail */
        rc = libssh2_sftp_readdir_ex(sftp_handle, mem, sizeof(mem),
                                     longentry, sizeof(longentry), &attrs);
        if(rc > 0) {
            /* rc is the length of the file name in the mem
               buffer */

            if(longentry[0] != '\0') {
                printf("%s\n", longentry);
            }
            else {
                if(attrs.flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) {
                    /* this should check what permissions it
                       is and print the output accordingly */
                    printf("--fix----- ");
                }
                else {
                    printf("---------- ");
                }

                if(attrs.flags & LIBSSH2_SFTP_ATTR_UIDGID) {
                    printf("%4d %4d ", (int) attrs.uid, (int) attrs.gid);
                }
                else {
                    printf("   -    - ");
                }

                if(attrs.flags & LIBSSH2_SFTP_ATTR_SIZE) {
                    printf("%8" LIBSSH2_FILESIZE_MASK " ", attrs.filesize);
                }

                printf("%s\n", mem);
            }
        }
        else {
            break;
        }

    } while(1);

    libssh2_sftp_closedir(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}